

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::flattenAccess
          (HlslParseContext *this,longlong uniqueId,int member,TStorageQualifier outerStorage,
          TType *dereferencedType,int subset)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  TPoolAllocator *this_00;
  TIntermSymbol *this_01;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  TString local_58;
  
  p_Var1 = &(this->flattenMap).
            super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->flattenMap).
           super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < uniqueId]) {
    if (uniqueId <= *(long *)(p_Var5 + 1)) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, uniqueId < *(long *)(p_Var4 + 1)))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  this_01 = (TIntermSymbol *)0x0;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    if (subset < 1) {
      subset = 0;
    }
    _Var3 = (&(p_Var5[2]._M_left)->_M_color)[subset + member];
    bVar2 = shouldFlatten(this,dereferencedType,outerStorage,false);
    if (bVar2) {
      this_00 = GetThreadPoolAllocator();
      this_01 = (TIntermSymbol *)TPoolAllocator::allocate(this_00,0x138);
      local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"flattenShadow","");
      TIntermSymbol::TIntermSymbol
                (this_01,uniqueId,&local_58,
                 (this->super_TParseContextBase).super_TParseVersions.language,dereferencedType,
                 (TString *)0x0);
    }
    else {
      this_01 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           *(TVariable **)
                            (&(p_Var5[1]._M_left)->_M_color +
                            (long)(int)(&(p_Var5[2]._M_left)->_M_color)[(int)_Var3] * 2));
      _Var3 = ~_S_red;
    }
    this_01->flattenSubset = _Var3;
  }
  return &this_01->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::flattenAccess(long long uniqueId, int member, TStorageQualifier outerStorage,
    const TType& dereferencedType, int subset)
{
    const auto flattenData = flattenMap.find(uniqueId);

    if (flattenData == flattenMap.end())
        return nullptr;

    // Calculate new cumulative offset from the packed tree
    int newSubset = flattenData->second.offsets[subset >= 0 ? subset + member : member];

    TIntermSymbol* subsetSymbol;
    if (!shouldFlatten(dereferencedType, outerStorage, false)) {
        // Finished flattening: create symbol for variable
        member = flattenData->second.offsets[newSubset];
        const TVariable* memberVariable = flattenData->second.members[member];
        subsetSymbol = intermediate.addSymbol(*memberVariable);
        subsetSymbol->setFlattenSubset(-1);
    } else {

        // If this is not the final flattening, accumulate the position and return
        // an object of the partially dereferenced type.
        subsetSymbol = new TIntermSymbol(uniqueId, "flattenShadow", getLanguage(), dereferencedType);
        subsetSymbol->setFlattenSubset(newSubset);
    }

    return subsetSymbol;
}